

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddLinkObjects
          (cmComputeLinkDepends *this,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *objs)

{
  bool bVar1;
  reference item;
  cmLinkItem *obj;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *objs_local;
  cmComputeLinkDepends *this_local;
  
  __end1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(objs);
  obj = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(objs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                *)&obj);
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
           ::operator*(&__end1);
    AddLinkObject(this,item);
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkObjects(std::vector<cmLinkItem> const& objs)
{
  for (cmLinkItem const& obj : objs) {
    this->AddLinkObject(obj);
  }
}